

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_reduceIndex(ZSTD_CCtx *zc,U32 reducerValue)

{
  ZSTD_strategy ZVar1;
  U32 *pUVar2;
  int nbRows;
  int iVar3;
  int iVar4;
  U32 UVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  iVar4 = 1 << ((byte)(zc->appliedParams).cParams.hashLog & 0x1f);
  iVar3 = iVar4 + 0xf;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  if (0xf < iVar4) {
    pUVar2 = (zc->blockState).matchState.hashTable;
    iVar4 = 0;
    iVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar6 = pUVar2[iVar4 + lVar8];
        UVar5 = uVar6 - reducerValue;
        if (uVar6 < reducerValue) {
          UVar5 = 0;
        }
        pUVar2[iVar4 + lVar8] = UVar5;
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 != 0x10);
      iVar4 = iVar4 + 0x10;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar3 >> 4);
  }
  ZVar1 = (zc->appliedParams).cParams.strategy;
  if (ZVar1 != ZSTD_fast) {
    iVar4 = 1 << ((byte)(zc->appliedParams).cParams.chainLog & 0x1f);
    iVar3 = iVar4 + 0xf;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    pUVar2 = (zc->blockState).matchState.chainTable;
    if (ZVar1 == ZSTD_btlazy2) {
      if (0xf < iVar4) {
        iVar4 = 0;
        iVar7 = 0;
        do {
          lVar8 = 0;
          do {
            UVar5 = reducerValue;
            if (pUVar2[iVar4 + lVar8] != 1) {
              UVar5 = 0;
            }
            uVar6 = UVar5 + pUVar2[iVar4 + lVar8];
            UVar5 = uVar6 - reducerValue;
            if (uVar6 < reducerValue) {
              UVar5 = 0;
            }
            pUVar2[iVar4 + lVar8] = UVar5;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 0x10);
          iVar4 = iVar4 + 0x10;
          iVar7 = iVar7 + 1;
        } while (iVar7 != iVar3 >> 4);
      }
    }
    else if (0xf < iVar4) {
      iVar4 = 0;
      iVar7 = 0;
      do {
        lVar8 = 0;
        do {
          UVar5 = pUVar2[iVar4 + lVar8] - reducerValue;
          if (pUVar2[iVar4 + lVar8] < reducerValue) {
            UVar5 = 0;
          }
          pUVar2[iVar4 + lVar8] = UVar5;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 0x10);
        iVar4 = iVar4 + 0x10;
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar3 >> 4);
    }
  }
  UVar5 = (zc->blockState).matchState.hashLog3;
  if (UVar5 != 0) {
    iVar4 = 1 << ((byte)UVar5 & 0x1f);
    iVar3 = iVar4 + 0xf;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    if (0xf < iVar4) {
      pUVar2 = (zc->blockState).matchState.hashTable3;
      iVar4 = 0;
      iVar7 = 0;
      do {
        lVar8 = 0;
        do {
          uVar6 = pUVar2[iVar4 + lVar8];
          UVar5 = uVar6 - reducerValue;
          if (uVar6 < reducerValue) {
            UVar5 = 0;
          }
          pUVar2[iVar4 + lVar8] = UVar5;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 0x10);
        iVar4 = iVar4 + 0x10;
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar3 >> 4);
    }
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_CCtx* zc, const U32 reducerValue)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    {   U32 const hSize = (U32)1 << zc->appliedParams.cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (zc->appliedParams.cParams.strategy != ZSTD_fast) {
        U32 const chainSize = (U32)1 << zc->appliedParams.cParams.chainLog;
        if (zc->appliedParams.cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}